

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

ON_PolynomialCurve * __thiscall
ON_PolynomialCurve::operator=(ON_PolynomialCurve *this,ON_BezierCurve *src)

{
  ON_4dPointArray *this_00;
  ON_4dPoint *this_01;
  int iVar1;
  ON_4dPoint *pOVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  ON_BezierCurve s;
  
  iVar1 = src->m_is_rat;
  this->m_dim = src->m_dim;
  this->m_is_rat = iVar1;
  iVar1 = src->m_order;
  this->m_order = iVar1;
  this_00 = &this->m_cv;
  ON_SimpleArray<ON_4dPoint>::Reserve(&this_00->super_ON_SimpleArray<ON_4dPoint>,(long)iVar1);
  iVar1 = src->m_order;
  if ((-1 < iVar1) && (iVar1 <= (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_capacity)) {
    (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_count = iVar1;
  }
  ON_SimpleArray<ON_4dPoint>::Zero(&this_00->super_ON_SimpleArray<ON_4dPoint>);
  if ((1 < this->m_order) && ((int)((uint)(src->m_is_rat != 0 && 0 < src->m_dim) + src->m_dim) < 5))
  {
    ON_BezierCurve::ON_BezierCurve(&s);
    s.m_dim = (src->m_dim + 1) - (uint)(src->m_is_rat == 0);
    s.m_is_rat = 0;
    s.m_order = src->m_order;
    s.m_cv = src->m_cv;
    bVar6 = ON_BezierCurve::Evaluate
                      (&s,0.0,this->m_order + -1,4,
                       &((this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a)->x);
    if (bVar6) {
      if (this->m_is_rat == 0) {
        ((this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a)->w = 1.0;
      }
      else if (this->m_dim < 3) {
        lVar9 = 0;
        for (lVar8 = 0; lVar8 < this->m_order; lVar8 = lVar8 + 1) {
          pOVar2 = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a;
          this_01 = (ON_4dPoint *)((long)&pOVar2->x + lVar9);
          pdVar7 = ON_4dPoint::operator[](this_01,this->m_dim);
          *(double *)((long)&pOVar2->w + lVar9) = *pdVar7;
          pdVar7 = ON_4dPoint::operator[](this_01,this->m_dim);
          *pdVar7 = 0.0;
          lVar9 = lVar9 + 0x20;
        }
      }
      iVar1 = this->m_order;
      pdVar7 = &(this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a[2].z;
      for (lVar8 = 2; lVar8 < iVar1; lVar8 = lVar8 + 1) {
        dVar10 = 1.0 / (double)(int)lVar8;
        dVar3 = pdVar7[-1];
        dVar4 = *pdVar7;
        dVar5 = pdVar7[1];
        ((ON_4dPoint *)(pdVar7 + -2))->x = ((ON_4dPoint *)(pdVar7 + -2))->x * dVar10;
        pdVar7[-1] = dVar3 * dVar10;
        *pdVar7 = dVar4 * dVar10;
        pdVar7[1] = dVar5 * dVar10;
        pdVar7 = pdVar7 + 4;
      }
    }
    else {
      ON_SimpleArray<ON_4dPoint>::Zero(&this_00->super_ON_SimpleArray<ON_4dPoint>);
      ((this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a)->w = 1.0;
    }
    s.m_cv = (double *)0x0;
    ON_BezierCurve::~ON_BezierCurve(&s);
  }
  return this;
}

Assistant:

ON_PolynomialCurve& ON_PolynomialCurve::operator=(const ON_BezierCurve& src)
{
  int i;
  double d;
  m_dim = src.m_dim;
  m_is_rat = src.m_is_rat;
  m_order = src.m_order;
  m_cv.Reserve( src.m_order );
  m_cv.SetCount( src.m_order );
  m_cv.Zero();
  //m_domain = src.m_domain;

  if ( m_order >= 2 && src.CVSize() <= 4 ) {
    ON_BezierCurve s; // scratch surface for homogeneous evaluation
    s.m_dim = src.m_is_rat ? src.m_dim+1 : src.m_dim;
    s.m_is_rat = 0;
    s.m_order = src.m_order;
    s.m_cv = src.m_cv;
    //s.m_domain.m_t[0] = 0.0;
    //s.m_domain.m_t[1] = 1.0;
    if ( s.Evaluate( 0.0, m_order-1, 4, &m_cv[0].x ) ) {
      if ( m_is_rat ) {
        if ( m_dim < 3 ) {
          for ( i = 0; i < m_order; i++ ) {
            ON_4dPoint& cv = m_cv[i];
            cv.w = cv[m_dim];
            cv[m_dim] = 0.0;
          }
        }
      }
      else {
        m_cv[0].w = 1.0;
      }
      for ( i = 2; i < m_order; i++ ) {
        d = 1.0/i;
        ON_4dPoint& cv = m_cv[i];
        cv.x *= d;
        cv.y *= d;
        cv.z *= d;
        cv.w *= d;
      }
    }
    else {
      m_cv.Zero();
      m_cv[0].w = 1.0;
    }
    s.m_cv = 0;
  }

  return *this;
}